

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

StringFormat ON_AngleValue::AngleStringFormatFromUnsigned(uint string_format_as_unsigned)

{
  if (string_format_as_unsigned < 4) {
    return (StringFormat)string_format_as_unsigned;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
             ,0x38,"","Invalid string_format_as_unsigned value.");
  return Unset.m_string_format;
}

Assistant:

ON_AngleValue::StringFormat ON_AngleValue::AngleStringFormatFromUnsigned(
  unsigned int string_format_as_unsigned
)
{
  switch (string_format_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_AngleValue::StringFormat::ExactDecimal);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_AngleValue::StringFormat::ExactFraction);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_AngleValue::StringFormat::CleanDecimal);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_AngleValue::StringFormat::CleanFraction);
  }
  ON_ERROR("Invalid string_format_as_unsigned value.");
  return (ON_AngleValue::Unset.m_string_format);
}